

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar1;
  void *pvVar2;
  uint uVar3;
  void **ppvVar4;
  Rep *pRVar5;
  int iVar6;
  
  if (0 < this->current_size_) {
    iVar6 = this->current_size_ + -1;
    this->current_size_ = iVar6;
    ppvVar4 = element_at(this,iVar6);
    pVVar1 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
             *ppvVar4;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      this->tagged_rep_or_elem_ = (void *)0x0;
    }
    else {
      pRVar5 = rep(this);
      pRVar5->allocated_size = pRVar5->allocated_size + -1;
      iVar6 = this->current_size_;
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
      }
      else {
        pRVar5 = rep(this);
        uVar3 = pRVar5->allocated_size;
      }
      if (iVar6 < (int)uVar3) {
        if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
          uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
        }
        else {
          pRVar5 = rep(this);
          uVar3 = pRVar5->allocated_size;
        }
        ppvVar4 = element_at(this,uVar3);
        pvVar2 = *ppvVar4;
        ppvVar4 = element_at(this,this->current_size_);
        *ppvVar4 = pvVar2;
      }
    }
    return pVVar1;
  }
  UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ();
}

Assistant:

Value<TypeHandler>* UnsafeArenaReleaseLast() {
    ABSL_DCHECK_GT(current_size_, 0);
    ExchangeCurrentSize(current_size_ - 1);
    auto* result = cast<TypeHandler>(element_at(current_size_));
    if (using_sso()) {
      tagged_rep_or_elem_ = nullptr;
    } else {
      --rep()->allocated_size;
      if (current_size_ < allocated_size()) {
        // There are cleared elements on the end; replace the removed element
        // with the last allocated element.
        element_at(current_size_) = element_at(allocated_size());
      }
    }
    return result;
  }